

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

TagHistoryModePolicy * __thiscall
despot::TagHistoryModePolicy::ComputeMode(TagHistoryModePolicy *this,Belief *belief)

{
  double dVar1;
  undefined8 uVar2;
  long *plVar3;
  long lVar4;
  long *in_RDX;
  long lVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  
  plVar3 = (long *)(**(code **)(*in_RDX + 0x30))();
  despot::State::State((State *)this);
  lVar4 = *plVar3;
  lVar5 = plVar3[1];
  if (lVar5 != lVar4) {
    lVar6 = *(long *)(belief + 0x90);
    dVar1 = 0.0;
    lVar7 = 0;
    do {
      lVar4 = *(long *)(lVar4 + lVar7);
      dVar8 = *(double *)(lVar4 + 0x18) + *(double *)(lVar6 + (long)*(int *)(lVar4 + 0xc) * 8);
      *(double *)(lVar6 + (long)*(int *)(lVar4 + 0xc) * 8) = dVar8;
      if (dVar1 < dVar8) {
        this->field_0x8 = *(undefined1 *)(lVar4 + 8);
        *(undefined4 *)&this->field_0x1c = *(undefined4 *)(lVar4 + 0x1c);
        uVar2 = *(undefined8 *)(lVar4 + 0x14);
        *(undefined8 *)&this->field_0xc = *(undefined8 *)(lVar4 + 0xc);
        *(undefined8 *)&this->field_0x14 = uVar2;
        *(double *)&this->field_0x18 = dVar8;
        dVar1 = dVar8;
      }
      lVar4 = *plVar3;
      lVar5 = plVar3[1];
      lVar7 = lVar7 + 8;
    } while (lVar5 != lVar4);
  }
  if (lVar5 - lVar4 != 0) {
    lVar6 = lVar5 - lVar4 >> 3;
    lVar5 = *(long *)(belief + 0x90);
    lVar7 = 0;
    do {
      *(undefined8 *)(lVar5 + (long)*(int *)(*(long *)(lVar4 + lVar7 * 8) + 0xc) * 8) = 0;
      lVar7 = lVar7 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
  }
  return this;
}

Assistant:

State ComputeMode(Belief* belief) const {
		const vector<State*>& particles = static_cast<ParticleBelief*>(belief)->particles();
		double maxWeight = 0;
		State mode;
		for (int i = 0; particles.size(); i++) {
			State* particle = particles[i];
			int id = particle->state_id;
			state_probs_[id] += particle->weight;

			if (state_probs_[id] > maxWeight) {
				maxWeight = state_probs_[id];
				mode = *particle;
				mode.weight = maxWeight;
			}
		}

		for (int i = 0; i < particles.size(); i++) {
			state_probs_[particles[i]->state_id] = 0;
		}

		return mode;
	}